

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetLocaleData
              (RecyclableObject *function,CallInfo callInfo,...)

{
  char cVar1;
  ScriptContext *scriptContext;
  JavascriptLibrary *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint32 length;
  BOOL BVar6;
  charcount_t cVar7;
  undefined4 *puVar8;
  JavascriptString *pJVar9;
  LPCSTR pCVar10;
  char *pcVar11;
  size_t sVar12;
  JavascriptString *pJVar13;
  long lVar14;
  size_t sVar15;
  Recycler *pRVar16;
  ulong uVar17;
  JavascriptString *pJVar18;
  JavascriptArray *pJVar19;
  uint uVar20;
  char16 *pcVar21;
  size_t sVar22;
  size_t size;
  Type *pTVar23;
  ulong uVar24;
  uint in_stack_00000010;
  ulong in_stack_00000020;
  Var in_stack_00000028;
  char local_138 [8];
  char localeID [157];
  undefined1 local_90 [8];
  TrackAllocData data;
  ulong local_60;
  int local_54;
  ScopedICUObject<UNumberingSystem_*,_&unumsys_close_70> SStack_50;
  int collationLen;
  ScopedUEnumeration collations;
  JavascriptArray *local_40;
  int local_34 [2];
  UErrorCode status;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  uVar20 = callInfo._0_4_;
  if (in_stack_00000010 != uVar20) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,1099,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b6683f;
    *puVar8 = 0;
  }
  if ((uVar20 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,1099,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00b6683f;
    *puVar8 = 0;
  }
  data._32_8_ = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr;
  if ((uVar20 & 0xffffff) == 3) {
LAB_00b65245:
    if (in_stack_00000020 >> 0x32 == 0) {
      if ((in_stack_00000020 & 0x1ffff00000000) != 0x1000000000000 &&
          (in_stack_00000020 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00b6683f;
        *puVar8 = 0;
      }
      if ((in_stack_00000020 & 0xffff000000000000) != 0x1000000000000) goto LAB_00b652f3;
    }
    bVar3 = VarIs<Js::JavascriptString>(in_stack_00000028);
    if (!bVar3) goto LAB_00b652f3;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,1099,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar3) goto LAB_00b6683f;
      *puVar8 = 0;
      if ((uVar20 & 0xffffff) == 3) goto LAB_00b65245;
    }
LAB_00b652f3:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x450,
                                "((args.Info.Count == 3 && (JavascriptNumber::Is(args.Values[1]) || TaggedInt::Is(args.Values[1])) && VarIs<JavascriptString>(args.Values[2])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar3) goto LAB_00b6683f;
    *puVar8 = 0;
  }
  if ((in_stack_00000020 & 0x1ffff00000000) != 0x1000000000000 &&
      (in_stack_00000020 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00b6683f;
    *puVar8 = 0;
  }
  if ((in_stack_00000020 & 0xffff000000000000) == 0x1000000000000) {
    if ((in_stack_00000020 & 0x1ffff00000000) != 0x1000000000000 &&
        (in_stack_00000020 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00b6683f;
      *puVar8 = 0;
    }
    if ((in_stack_00000020 & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar3) goto LAB_00b6683f;
      *puVar8 = 0;
    }
  }
  else {
    if (in_stack_00000020 >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar3) goto LAB_00b6683f;
      *puVar8 = 0;
    }
    in_stack_00000020 = (ulong)(uint)(int)(double)(in_stack_00000020 ^ 0xfffc000000000000);
  }
  local_34[0] = 0;
  memset((char (*) [157])local_138,0,0x9d);
  pJVar9 = UnsafeVarTo<Js::JavascriptString>(in_stack_00000028);
  LangtagToLocaleID<157ul>(pJVar9,(char (*) [157])local_138);
  if (5 < (uint)in_stack_00000020) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x523,"(false)","GetLocaleData called with unknown kind parameter")
    ;
    if (bVar3) {
      *puVar8 = 0;
      return (JavascriptArray *)0x0;
    }
    goto LAB_00b6683f;
  }
  this = *(JavascriptLibrary **)(data._32_8_ + 8);
  switch(in_stack_00000020 & 0xffffffff) {
  case 1:
    local_90 = (undefined1  [8])ucol_open_70(local_138,local_34);
    iVar5 = ucol_getAttribute_70(local_90,2,local_34);
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      pCVar10 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x497,"(false)",pCVar10);
      if (!bVar3) goto LAB_00b6683f;
      *puVar8 = 0;
    }
    local_40 = JavascriptLibrary::CreateArray(this,3);
    pTVar23 = &this->stringCache;
    pJVar9 = StringCache::GetFalseDisplay(pTVar23);
    pJVar18 = StringCache::GetIntlCaseFirstUpper(pTVar23);
    pJVar13 = StringCache::GetIntlCaseFirstLower(pTVar23);
    if (iVar5 == 0x19) {
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,0,pJVar18,0);
LAB_00b667ef:
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,1,pJVar13,0);
    }
    else {
      if (iVar5 == 0x18) {
        (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (local_40,0,pJVar13,0);
        pJVar13 = pJVar18;
        goto LAB_00b667ef;
      }
      if (iVar5 != 0x10) goto LAB_00b6681d;
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,0,pJVar9,0);
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,1,pJVar18,0);
      pJVar9 = pJVar13;
    }
    (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (local_40,2,pJVar9,0);
LAB_00b6681d:
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UCollator_*,_&ucol_close_70>::~ScopedICUObject
              ((ScopedICUObject<UCollator_*,_&ucol_close_70> *)local_90);
    return local_40;
  case 2:
    local_90 = (undefined1  [8])ucol_open_70(local_138,local_34);
    iVar5 = ucol_getAttribute_70(local_90,7,local_34);
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      pCVar10 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x4b5,"(false)",pCVar10);
      if (!bVar3) goto LAB_00b6683f;
      *puVar8 = 0;
    }
    local_40 = JavascriptLibrary::CreateArray(this,2);
    pJVar9 = StringCache::GetFalseDisplay(&this->stringCache);
    pJVar13 = StringCache::GetTrueDisplay(&this->stringCache);
    if (iVar5 == 0x11) {
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,0,pJVar13,0);
    }
    else {
      if (iVar5 != 0x10) goto LAB_00b6681d;
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,0,pJVar9,0);
      pJVar9 = pJVar13;
    }
    (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (local_40,1,pJVar9,0);
    goto LAB_00b6681d;
  case 3:
    SStack_50.object =
         (UNumberingSystem *)ucal_getKeywordValuesForLocale_70("calendar",local_138,0,local_34);
    length = uenum_count_70(SStack_50.object,local_34);
    local_40 = JavascriptLibrary::CreateArray(this,length);
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      pCVar10 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x4ca,"(false)",pCVar10);
      if (!bVar3) goto LAB_00b6683f;
      *puVar8 = 0;
    }
    local_54 = 0;
    lVar14 = uenum_next_70(SStack_50.object,&local_54,local_34);
    if (lVar14 != 0) {
      collations.object = (UEnumeration *)__tls_get_addr(&PTR_0155fe48);
      local_60 = 0;
      do {
        if (local_34[0] == 7) {
          Throw::OutOfMemory();
        }
        if (local_34[0] < 1 && local_34[0] != -0x7c) {
          if (local_54 < 1) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)collations.object = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                        ,0x4d1,"(calendar != nullptr && calendarLen > 0)",
                                        "calendar != nullptr && calendarLen > 0");
            goto LAB_00b65c98;
          }
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)collations.object = 1;
          pCVar10 = (LPCSTR)u_errorName_70(local_34[0]);
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x4d1,"(false)",pCVar10);
LAB_00b65c98:
          if (bVar3 == false) goto LAB_00b6683f;
          *(undefined4 *)collations.object = 0;
        }
        pcVar11 = (char *)uloc_toUnicodeLocaleType_70("calendar",lVar14);
        if (pcVar11 == (char *)0x0) {
          Throw::OutOfMemory();
        }
        sVar12 = strlen(pcVar11);
        pRVar16 = *(Recycler **)(data._32_8_ + 0x1200);
        sVar15 = strlen(pcVar11);
        data.plusSize = sVar15 + 1;
        local_90 = (undefined1  [8])&char16_t::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.count = (size_t)anon_var_dwarf_6708ef9;
        data.filename._0_4_ = 0x4d8;
        pRVar16 = Memory::Recycler::TrackAllocInfo(pRVar16,(TrackAllocData *)local_90);
        sVar15 = strlen(pcVar11);
        lVar14 = sVar15 + 1;
        if (lVar14 == 0) {
          pcVar21 = (char16 *)&DAT_00000008;
          Memory::Recycler::ClearTrackAllocInfo(pRVar16,(TrackAllocData *)0x0);
        }
        else {
          sVar22 = lVar14 * 2;
          if (lVar14 < 0) {
            sVar22 = 0xffffffffffffffff;
          }
          BVar6 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar6 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)collations.object = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                        "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar3) goto LAB_00b6683f;
            *(undefined4 *)collations.object = 0;
          }
          if (sVar22 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)collations.object = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)"
                                        ,"byteSize != 0 || !TAllocator::FakeZeroLengthArray");
            if (!bVar3) goto LAB_00b6683f;
            *(undefined4 *)collations.object = 0;
          }
          pcVar21 = (char16 *)
                    Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                              (pRVar16,sVar22);
          if (pcVar21 == (char16 *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)collations.object = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar3) goto LAB_00b6683f;
            *(undefined4 *)collations.object = 0;
          }
        }
        if (sVar12 < 0xffffffff) {
          if (pcVar21 == (char16 *)0x0) goto LAB_00b65ebd;
          uVar24 = 0;
          if (sVar12 != 0) {
            do {
              cVar1 = pcVar11[uVar24];
              if (cVar1 < '\x01') {
                bVar3 = uVar24 < 3;
                uVar24 = uVar24 - 3;
                if (bVar3) {
                  uVar24 = 0;
                }
              }
              else {
                pcVar21[uVar24] = (short)cVar1;
              }
            } while (('\0' < cVar1) && (uVar24 = uVar24 + 1, uVar24 < sVar12));
          }
          if (sVar12 - uVar24 == 0) {
            pcVar21[sVar12] = L'\0';
            uVar17 = sVar12 & 0xffffffff;
LAB_00b65fce:
            bVar3 = true;
            sVar15 = uVar17;
            if (pcVar21[uVar17] != L'\0') {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *(undefined4 *)collations.object = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                                          ,0xaa,"(destString[*destCount] == 0)",
                                          "destString[*destCount] == 0");
              if (!bVar4) goto LAB_00b6683f;
              *(undefined4 *)collations.object = 0;
            }
          }
          else {
            unique0x00004a80 = (LPCUTF8)(pcVar11 + uVar24);
            cVar7 = utf8::ByteIndexIntoCharacterIndex(unique0x00004a80,sVar12 - uVar24,doDefault);
            uVar17 = (ulong)(cVar7 + (int)uVar24);
            bVar3 = false;
            sVar15 = 0;
            if (uVar17 <= sVar12) {
              utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                        (pcVar21 + uVar24,stack0xffffffffffffff68,(LPCUTF8)(pcVar11 + sVar12),
                         doAllowInvalidWCHARs,(bool *)0x0);
              goto LAB_00b65fce;
            }
          }
        }
        else {
          *pcVar21 = L'\0';
LAB_00b65ebd:
          bVar3 = false;
          sVar15 = 0;
        }
        if ((!bVar3) || (0x7ffffffd < (uint)sVar15 || sVar12 != sVar15)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)collations.object = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x4e4,
                                      "(hr == ((HRESULT)0x00000000L) && unicodeCalendar16Len == unicodeCalendarLen && unicodeCalendar16Len < MaxCharCount)"
                                      ,"Unicode calendar char16 conversion was unsuccessful");
          if (!bVar3) goto LAB_00b6683f;
          *(undefined4 *)collations.object = 0;
        }
        pJVar9 = JavascriptString::NewWithBuffer(pcVar21,(uint)sVar15,(ScriptContext *)data._32_8_);
        (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (local_40,local_60,pJVar9,0);
        lVar14 = uenum_next_70(SStack_50.object,&local_54,local_34);
        local_60 = (ulong)((int)local_60 + 1);
      } while (lVar14 != 0);
    }
    goto LAB_00b66784;
  case 4:
    SStack_50.object = (UNumberingSystem *)unumsys_open_70(local_138,local_34);
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      pCVar10 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x4f5,"(false)",pCVar10);
      if (!bVar3) goto LAB_00b6683f;
      *puVar8 = 0;
    }
    pcVar11 = (char *)unumsys_getName_70(SStack_50.object);
    local_90 = (undefined1  [8])0x0;
    sVar12 = strnlen(pcVar11,0x7fffffff);
    utf8::NarrowStringToWide<void*(*)(unsigned_long)>
              (utf8::malloc_allocator::allocate,pcVar11,sVar12,(LPWSTR *)local_90,
               (charcount_t *)&data,&data.plusSize);
    data.count = CONCAT71(data.count._1_7_,1);
    pJVar19 = JavascriptLibrary::CreateArray(this,0x16);
    pJVar9 = JavascriptString::NewCopySz((char16 *)local_90,(ScriptContext *)data._32_8_);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0,pJVar9,0);
    pTVar23 = &this->stringCache;
    pJVar9 = StringCache::GetIntlNumsysArab(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,1,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysArabext(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,2,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysBali(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,3,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysBeng(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,4,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysDeva(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,5,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysFullwide(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,6,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysGujr(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,7,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysGuru(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,8,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysHanidec(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,9,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysKhmr(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,10,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysKnda(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0xb,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysLaoo(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0xc,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysLatn(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0xd,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysLimb(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0xe,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysMlym(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0xf,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysMong(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0x10,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysMymr(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0x11,pJVar9);
    pJVar9 = StringCache::GetIntlNumsysOrya(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0x12,pJVar9);
    pJVar9 = StringCache::GetIntlNumsysTamldec(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0x13,pJVar9);
    pJVar9 = StringCache::GetIntlNumsysTelu(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0x14,pJVar9);
    pJVar9 = StringCache::GetIntlNumsysThai(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0x15,pJVar9,0);
    pJVar9 = StringCache::GetIntlNumsysTibt(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0x16,pJVar9,0);
    if ((local_90 != (undefined1  [8])0x0) && ((char)data.count == '\x01')) {
      free((void *)local_90);
    }
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UNumberingSystem_*,_&unumsys_close_70>::
    ~ScopedICUObject(&stack0xffffffffffffffb0);
    return pJVar19;
  case 5:
    pJVar19 = JavascriptLibrary::CreateArray(this,5);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,0,(this->super_JavascriptLibraryBase).nullValue.ptr,0);
    pTVar23 = &this->stringCache;
    pJVar9 = StringCache::GetIntlHourCycle11(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,1,pJVar9,0);
    pJVar9 = StringCache::GetIntlHourCycle12(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,2,pJVar9,0);
    pJVar9 = StringCache::GetIntlHourCycle23(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,3,pJVar9,0);
    pJVar9 = StringCache::GetIntlHourCycle24(pTVar23);
    (*(pJVar19->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar19,4,pJVar9,0);
    return pJVar19;
  }
  SStack_50.object =
       (UNumberingSystem *)ucol_getKeywordValuesForLocale_70("collation",local_138,0,local_34);
  iVar5 = uenum_count_70(SStack_50.object,local_34);
  if (local_34[0] == 7) {
    Throw::OutOfMemory();
  }
  if (local_34[0] < 1 && local_34[0] != -0x7c) {
    if (iVar5 < 3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x466,"(collationsCount > 2)","collationsCount > 2");
      goto LAB_00b662c2;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    pCVar10 = (LPCSTR)u_errorName_70(local_34[0]);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x466,"(false)",pCVar10);
LAB_00b662c2:
    if (bVar3 == false) {
LAB_00b6683f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  local_40 = JavascriptLibrary::CreateArray(this,iVar5 - 1);
  (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
    .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
            (local_40,0,(this->super_JavascriptLibraryBase).nullValue.ptr,0);
  local_54 = 0;
  pcVar11 = (char *)uenum_next_70(SStack_50.object,&local_54,local_34);
  collations.object = (UEnumeration *)__tls_get_addr(&PTR_0155fe48);
  local_60 = 0;
  while (pcVar11 != (char *)0x0) {
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (local_34[0] < 1 && local_34[0] != -0x7c) {
      if (local_54 < 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *(undefined4 *)collations.object = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x471,"(collation != nullptr && collationLen > 0)",
                                    "collation != nullptr && collationLen > 0");
        goto LAB_00b663cf;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *(undefined4 *)collations.object = 1;
      pCVar10 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x471,"(false)",pCVar10);
LAB_00b663cf:
      if (bVar3 == false) goto LAB_00b6683f;
      *(undefined4 *)collations.object = 0;
    }
    iVar5 = strcmp(pcVar11,"standard");
    if ((iVar5 != 0) && (iVar5 = strcmp(pcVar11,"search"), iVar5 != 0)) {
      pcVar11 = (char *)uloc_toUnicodeLocaleType_70("collation",pcVar11);
      if (pcVar11 == (char *)0x0) {
        Throw::OutOfMemory();
      }
      sVar12 = strlen(pcVar11);
      sVar22 = sVar12 + 1;
      local_90 = (undefined1  [8])&char16_t::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_6708ef9;
      data.filename._0_4_ = 0x47d;
      data.plusSize = sVar22;
      pRVar16 = Memory::Recycler::TrackAllocInfo
                          (*(Recycler **)(data._32_8_ + 0x1200),(TrackAllocData *)local_90);
      if (sVar22 == 0) {
        pcVar21 = (char16 *)&DAT_00000008;
        Memory::Recycler::ClearTrackAllocInfo(pRVar16,(TrackAllocData *)0x0);
      }
      else {
        size = sVar22 * 2;
        if ((long)sVar22 < 0) {
          size = 0xffffffffffffffff;
        }
        BVar6 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)collations.object = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar3) goto LAB_00b6683f;
          *(undefined4 *)collations.object = 0;
        }
        if (size == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)collations.object = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                      "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
          if (!bVar3) goto LAB_00b6683f;
          *(undefined4 *)collations.object = 0;
        }
        pcVar21 = (char16 *)
                  Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                            (pRVar16,size);
        if (pcVar21 == (char16 *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)collations.object = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar3) goto LAB_00b6683f;
          *(undefined4 *)collations.object = 0;
        }
      }
      if (sVar12 < 0xffffffff) {
        if (pcVar21 == (char16 *)0x0) goto LAB_00b66612;
        uVar24 = 0;
        if (sVar12 != 0) {
          do {
            cVar1 = pcVar11[uVar24];
            if (cVar1 < '\x01') {
              bVar3 = uVar24 < 3;
              uVar24 = uVar24 - 3;
              if (bVar3) {
                uVar24 = 0;
              }
            }
            else {
              pcVar21[uVar24] = (short)cVar1;
            }
          } while (('\0' < cVar1) && (uVar24 = uVar24 + 1, uVar24 < sVar12));
        }
        if (sVar12 - uVar24 == 0) {
          pcVar21[sVar12] = L'\0';
          uVar17 = sVar12 & 0xffffffff;
LAB_00b66716:
          bVar3 = true;
          sVar15 = uVar17;
          if (pcVar21[uVar17] != L'\0') {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)collations.object = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                                        ,0xaa,"(destString[*destCount] == 0)",
                                        "destString[*destCount] == 0");
            if (!bVar4) goto LAB_00b6683f;
            *(undefined4 *)collations.object = 0;
          }
        }
        else {
          unique0x00004a80 = (LPCUTF8)(pcVar11 + uVar24);
          cVar7 = utf8::ByteIndexIntoCharacterIndex(unique0x00004a80,sVar12 - uVar24,doDefault);
          uVar17 = (ulong)(cVar7 + (int)uVar24);
          bVar3 = false;
          sVar15 = 0;
          if (uVar17 <= sVar12) {
            utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                      (pcVar21 + uVar24,stack0xffffffffffffff68,(LPCUTF8)(pcVar11 + sVar12),
                       doAllowInvalidWCHARs,(bool *)0x0);
            goto LAB_00b66716;
          }
        }
      }
      else {
        *pcVar21 = L'\0';
LAB_00b66612:
        bVar3 = false;
        sVar15 = 0;
      }
      if ((!bVar3) || (0x7ffffffd < (uint)sVar15 || sVar12 != sVar15)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *(undefined4 *)collations.object = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x489,
                                    "(hr == ((HRESULT)0x00000000L) && unicodeCollation16Len == unicodeCollationLen && unicodeCollation16Len < MaxCharCount)"
                                    ,"Unicode collation char16 conversion was unsuccessful");
        if (!bVar3) goto LAB_00b6683f;
        *(undefined4 *)collations.object = 0;
      }
      pJVar9 = JavascriptString::NewWithBuffer(pcVar21,(uint)sVar15,(ScriptContext *)data._32_8_);
      local_60 = (ulong)((int)local_60 + 1);
      (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (local_40,local_60,pJVar9,0);
    }
    pcVar11 = (char *)uenum_next_70(SStack_50.object,&local_54,local_34);
  }
LAB_00b66784:
  PlatformAgnostic::ICUHelpers::ScopedICUObject<UEnumeration_*,_&uenum_close_70>::~ScopedICUObject
            ((ScopedICUObject<UEnumeration_*,_&uenum_close_70> *)&stack0xffffffffffffffb0);
  return local_40;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_GetLocaleData(RecyclableObject* function, CallInfo callInfo, ...)
    {
#ifdef INTL_ICU
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(
            args.Info.Count == 3 &&
            (JavascriptNumber::Is(args.Values[1]) || TaggedInt::Is(args.Values[1])) &&
            VarIs<JavascriptString>(args.Values[2])
        );

        LocaleDataKind kind = (LocaleDataKind) (TaggedInt::Is(args.Values[1])
            ? TaggedInt::ToInt32(args.Values[1])
            : (int) JavascriptNumber::GetValue(args.Values[1]));

        JavascriptArray *ret = nullptr;

        UErrorCode status = U_ZERO_ERROR;
        char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
        JavascriptString *langtag = UnsafeVarTo<JavascriptString>(args.Values[2]);
        LangtagToLocaleID(langtag, localeID);

        JavascriptLibrary *library = scriptContext->GetLibrary();
        PropertyOperationFlags flag = PropertyOperationFlags::PropertyOperation_None;

        if (kind == LocaleDataKind::Collation)
        {
            ScopedUEnumeration collations(ucol_getKeywordValuesForLocale("collation", localeID, false, &status));
            int collationsCount = uenum_count(collations, &status);

            // we expect collationsCount to have at least "standard" and "search" in it
            ICU_ASSERT(status, collationsCount > 2);

            // the return array can't include "standard" and "search", but must have its first element be null (count - 2 + 1) [#sec-intl-collator-internal-slots]
            ret = library->CreateArray(collationsCount - 1);
            ret->SetItem(0, library->GetNull(), flag);

            int collationLen = 0;
            const char *collation = nullptr;
            int i = 0;
            for (collation = uenum_next(collations, &collationLen, &status); collation != nullptr; collation = uenum_next(collations, &collationLen, &status))
            {
                ICU_ASSERT(status, collation != nullptr && collationLen > 0);
                if (strcmp(collation, "standard") == 0 || strcmp(collation, "search") == 0)
                {
                    // continue does not create holes in ret because i is set outside the loop
                    continue;
                }

                // OS#17172584: OOM during uloc_toUnicodeLocaleType can make this return nullptr even for known collations
                const char *unicodeCollation = ThrowOOMIfNull(uloc_toUnicodeLocaleType("collation", collation));
                const size_t unicodeCollationLen = strlen(unicodeCollation);

                // we only need strlen(unicodeCollation) + 1 char16s because unicodeCollation will always be ASCII (funnily enough)
                char16 *unicodeCollation16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, unicodeCollationLen + 1);
                charcount_t unicodeCollation16Len = 0;
                HRESULT hr = utf8::NarrowStringToWideNoAlloc(
                    unicodeCollation,
                    unicodeCollationLen,
                    unicodeCollation16,
                    unicodeCollationLen + 1,
                    &unicodeCollation16Len
                );
                AssertOrFailFastMsg(
                    hr == S_OK && unicodeCollation16Len == unicodeCollationLen && unicodeCollation16Len < MaxCharCount,
                    "Unicode collation char16 conversion was unsuccessful"
                );
                // i + 1 to not overwrite leading null element
                ret->SetItem(i + 1, JavascriptString::NewWithBuffer(
                    unicodeCollation16,
                    unicodeCollation16Len,
                    scriptContext
                ), PropertyOperationFlags::PropertyOperation_None);
                i++;
            }
        }
        else if (kind == LocaleDataKind::CaseFirst)
        {
            ScopedUCollator collator(ucol_open(localeID, &status));
            UColAttributeValue kf = ucol_getAttribute(collator, UCOL_CASE_FIRST, &status);
            ICU_ASSERT(status, true);
            ret = library->CreateArray(3);

            JavascriptString *falseStr = library->GetFalseDisplayString();
            JavascriptString *upperStr = library->GetIntlCaseFirstUpperString();
            JavascriptString *lowerStr = library->GetIntlCaseFirstLowerString();

            if (kf == UCOL_OFF)
            {
                ret->SetItem(0, falseStr, flag);
                ret->SetItem(1, upperStr, flag);
                ret->SetItem(2, lowerStr, flag);
            }
            else if (kf == UCOL_UPPER_FIRST)
            {
                ret->SetItem(0, upperStr, flag);
                ret->SetItem(1, lowerStr, flag);
                ret->SetItem(2, falseStr, flag);
            }
            else if (kf == UCOL_LOWER_FIRST)
            {
                ret->SetItem(0, lowerStr, flag);
                ret->SetItem(1, upperStr, flag);
                ret->SetItem(2, falseStr, flag);
            }
        }
        else if (kind == LocaleDataKind::Numeric)
        {
            ScopedUCollator collator(ucol_open(localeID, &status));
            UColAttributeValue kn = ucol_getAttribute(collator, UCOL_NUMERIC_COLLATION, &status);
            ICU_ASSERT(status, true);
            ret = library->CreateArray(2);

            JavascriptString *falseStr = library->GetFalseDisplayString();
            JavascriptString *trueStr = library->GetTrueDisplayString();

            if (kn == UCOL_OFF)
            {
                ret->SetItem(0, falseStr, flag);
                ret->SetItem(1, trueStr, flag);
            }
            else if (kn == UCOL_ON)
            {
                ret->SetItem(0, trueStr, flag);
                ret->SetItem(1, falseStr, flag);
            }
        }
        else if (kind == LocaleDataKind::Calendar)
        {
            ScopedUEnumeration calendars(ucal_getKeywordValuesForLocale("calendar", localeID, false, &status));
            ret = library->CreateArray(uenum_count(calendars, &status));
            ICU_ASSERT(status, true);

            int calendarLen = 0;
            const char *calendar = nullptr;
            int i = 0;
            for (calendar = uenum_next(calendars, &calendarLen, &status); calendar != nullptr; calendar = uenum_next(calendars, &calendarLen, &status))
            {
                ICU_ASSERT(status, calendar != nullptr && calendarLen > 0);

                // OS#17172584: OOM during uloc_toUnicodeLocaleType can make this return nullptr even for known calendars
                const char *unicodeCalendar = ThrowOOMIfNull(uloc_toUnicodeLocaleType("calendar", calendar));
                const size_t unicodeCalendarLen = strlen(unicodeCalendar);

                // we only need strlen(unicodeCalendar) + 1 char16s because unicodeCalendar will always be ASCII (funnily enough)
                char16 *unicodeCalendar16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, strlen(unicodeCalendar) + 1);
                charcount_t unicodeCalendar16Len = 0;
                HRESULT hr = utf8::NarrowStringToWideNoAlloc(
                    unicodeCalendar,
                    unicodeCalendarLen,
                    unicodeCalendar16,
                    unicodeCalendarLen + 1,
                    &unicodeCalendar16Len
                );
                AssertOrFailFastMsg(
                    hr == S_OK && unicodeCalendar16Len == unicodeCalendarLen && unicodeCalendar16Len < MaxCharCount,
                    "Unicode calendar char16 conversion was unsuccessful"
                );
                ret->SetItem(i, JavascriptString::NewWithBuffer(
                    unicodeCalendar16,
                    static_cast<charcount_t>(unicodeCalendar16Len),
                    scriptContext
                ), flag);
                i++;
            }
        }
        else if (kind == LocaleDataKind::NumberingSystem)
        {
            // unumsys_openAvailableNames has multiple bugs (http://bugs.icu-project.org/trac/ticket/11908) and also
            // does not provide a locale-specific set of numbering systems
            // the Intl spec provides a list of required numbering systems to support in #table-numbering-system-digits
            // For now, assume that all of those numbering systems are supported, and just get the default using unumsys_open
            // unumsys_open will also ensure that "native", "traditio", and "finance" are not returned, as per #sec-intl.datetimeformat-internal-slots
            ScopedUNumberingSystem numsys(unumsys_open(localeID, &status));
            ICU_ASSERT(status, true);
            utf8::NarrowToWide numsysName(unumsys_getName(numsys));

            // NOTE: update the initial array length if the list of available numbering systems changes in the future!
            ret = library->CreateArray(22);
            int i = 0;
            ret->SetItem(i++, JavascriptString::NewCopySz(numsysName, scriptContext), flag);

            // It doesn't matter that item 0 will be in the array twice (aside for size), because item 0 is the
            // preferred numbering system for the given locale, so it has precedence over everything else
            ret->SetItem(i++, library->GetIntlNumsysArabString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysArabextString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysBaliString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysBengString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysDevaString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysFullwideString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysGujrString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysGuruString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysHanidecString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysKhmrString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysKndaString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysLaooString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysLatnString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysLimbString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysMlymString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysMongString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysMymrString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysOryaString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysTamldecString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysTeluString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysThaiString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysTibtString(), flag);
        }
        else if (kind == LocaleDataKind::HourCycle)
        {
            // #sec-intl.datetimeformat-internal-slots: "[[LocaleData]][locale].hc must be < null, h11, h12, h23, h24 > for all locale values"
            ret = library->CreateArray(5);
            int i = 0;
            ret->SetItem(i++, library->GetNull(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle11String(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle12String(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle23String(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle24String(), flag);
        }
        else
        {
            AssertOrFailFastMsg(false, "GetLocaleData called with unknown kind parameter");
        }

        return ret;
#else
        AssertOrFailFastMsg(false, "Intl with Windows Globalization should never call GetLocaleData");
        return nullptr;
#endif
    }